

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinput.cpp
# Opt level: O2

void __thiscall
my_input_handlers::Input_Event_Notify
          (my_input_handlers *this,Am_Drawonable *draw,Am_Input_Event *ev)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  Am_Input_Char local_d4;
  Am_Input_Char local_d0;
  Am_Input_Char local_cc;
  Am_Input_Char local_c8;
  Am_Input_Char local_c4;
  Am_Input_Char local_c0;
  Am_Input_Char local_bc;
  Am_Input_Char local_b8;
  Am_Input_Char local_b4;
  Am_Input_Char local_b0;
  Am_Input_Char ic2;
  Am_Value v2;
  Am_Value v;
  char s [100];
  
  Am_Input_Char::As_Short_String((char *)ev);
  poVar3 = std::operator<<((ostream *)&std::cout,"My Input Event \"");
  poVar3 = (ostream *)operator<<(poVar3,(Am_Input_Char *)ev);
  poVar3 = std::operator<<(poVar3,"\" short=\"");
  poVar3 = std::operator<<(poVar3,s);
  std::operator<<(poVar3,"\" on ");
  if (d == draw) {
    pcVar6 = "d\n";
LAB_001027cc:
    std::operator<<((ostream *)&std::cout,pcVar6);
  }
  else if (d2 == draw) {
    pcVar6 = "d2\n";
    goto LAB_001027cc;
  }
  Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&v);
  Am_Input_Char::Am_Input_Char(&ic2,&v);
  Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&v2);
  cVar1 = Am_Input_Char::As_Char();
  poVar3 = std::operator<<((ostream *)&std::cout,"   (unsigned char)=`");
  poVar3 = std::operator<<(poVar3,cVar1);
  poVar3 = std::operator<<(poVar3,"\'=(char)=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(poVar3," (long) ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(poVar3," back to Input_Char = ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(poVar3," new long = ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  if (test_ic_set == true) {
    bVar2 = Am_Input_Char::operator==(&ev->input_char,test_ic);
    pcVar6 = "   *NOT* = ";
    if (bVar2) {
      pcVar6 = "   *=* ";
    }
    std::operator<<((ostream *)&std::cout,pcVar6);
    poVar3 = std::operator<<((ostream *)&std::cout," test_ic (");
    poVar3 = (ostream *)operator<<(poVar3,(Am_Input_Char *)&test_ic);
    std::operator<<(poVar3,")\n");
    std::ostream::flush();
  }
  Am_Input_Char::Am_Input_Char(&local_b0,"CONTROL_M",true);
  bVar2 = Am_Input_Char::operator==(&ev->input_char,local_b0);
  if (bVar2) {
LAB_00102946:
    std::operator<<((ostream *)&std::cout,"==Turning on want move\n");
    uVar5 = 1;
    lVar4 = 400;
  }
  else {
    Am_Input_Char::Am_Input_Char(&local_b4,"CONTROL_m",true);
    bVar2 = Am_Input_Char::operator==(&ev->input_char,local_b4);
    if (bVar2) {
      std::operator<<((ostream *)&std::cout,"==Turning off want move\n");
      lVar4 = 400;
LAB_0010299e:
      uVar5 = 0;
    }
    else {
      Am_Input_Char::Am_Input_Char(&local_b8,"CONTROL_x",true);
      bVar2 = Am_Input_Char::operator==(&ev->input_char,local_b8);
      if (bVar2) goto LAB_00102946;
      Am_Input_Char::Am_Input_Char(&local_bc,"CONTROL_e",true);
      bVar2 = Am_Input_Char::operator==(&ev->input_char,local_bc);
      if (bVar2) {
        std::operator<<((ostream *)&std::cout,"==Turning off enter leave\n");
        lVar4 = 0x188;
        goto LAB_0010299e;
      }
      Am_Input_Char::Am_Input_Char(&local_c0,"CONTROL_E",true);
      bVar2 = Am_Input_Char::operator==(&ev->input_char,local_c0);
      if (bVar2) {
        std::operator<<((ostream *)&std::cout,"==Turning on enter leave\n");
        uVar5 = 1;
        lVar4 = 0x188;
      }
      else {
        Am_Input_Char::Am_Input_Char(&local_c4,"CONTROL_w",true);
        bVar2 = Am_Input_Char::operator==(&ev->input_char,local_c4);
        if (bVar2) {
          std::operator<<((ostream *)&std::cout,"==Turning off multiple windows\n");
          lVar4 = 0x198;
          goto LAB_0010299e;
        }
        Am_Input_Char::Am_Input_Char(&local_c8,"CONTROL_W",true);
        bVar2 = Am_Input_Char::operator==(&ev->input_char,local_c8);
        if (!bVar2) {
          Am_Input_Char::Am_Input_Char(&local_cc,"CONTROL_t",true);
          bVar2 = Am_Input_Char::operator==(&ev->input_char,local_cc);
          if (bVar2) {
            std::operator<<((ostream *)&std::cout,"type new input string to test against: ");
            std::operator>>((basic_istream<char,_std::char_traits<char>_> *)&std::cin,s);
            Am_Input_Char::Am_Input_Char(&local_d0,s,true);
            Am_Input_Char::operator=(&test_ic,&local_d0);
            test_ic_set = true;
          }
          else {
            Am_Input_Char::Am_Input_Char(&local_d4,"CONTROL_q",true);
            bVar2 = Am_Input_Char::operator==(&ev->input_char,local_d4);
            if (bVar2) {
              std::operator<<((ostream *)&std::cout,"Quitting\n");
              std::ostream::flush();
              exit(0);
            }
          }
          goto LAB_001029ac;
        }
        std::operator<<((ostream *)&std::cout,"==Turning on multiple windows\n");
        uVar5 = 1;
        lVar4 = 0x198;
      }
    }
  }
  (**(code **)(*(long *)draw + lVar4))(draw,uVar5,*(long *)draw,uVar5);
LAB_001029ac:
  Am_Value::~Am_Value(&v2);
  Am_Value::~Am_Value(&v);
  return;
}

Assistant:

void Input_Event_Notify(Am_Drawonable *draw, Am_Input_Event *ev) override
  {
    char s[100];

    ev->input_char.As_Short_String(s);
    cout << "My Input Event \"" << ev->input_char << "\" short=\"" << s
         << "\" on ";
    if (draw == d)
      cout << "d\n";
    else if (draw == d2)
      cout << "d2\n";

    Am_Value v = Am_Value(ev->input_char);
    Am_Input_Char ic2 = v;
    Am_Value v2 = Am_Value(ic2);
    unsigned char c = ev->input_char.As_Char();

    cout << "   (unsigned char)=`" << c << "'=(char)=" << (unsigned int)c
         << (long)c << " (long) " << v.value.long_value
         << " back to Input_Char = " << v2.value.long_value
         << " new long = " << v2.value.long_value << endl;

    if (test_ic_set) {
      if (ev->input_char == test_ic)
        cout << "   *=* ";
      else
        cout << "   *NOT* = ";
      cout << " test_ic (" << test_ic << ")\n" << flush;
    }
    if (ev->input_char == "CONTROL_M") {
      cout << "==Turning on want move\n";
      draw->Set_Want_Move(true);
    } else if (ev->input_char == "CONTROL_m") {
      cout << "==Turning off want move\n";
      draw->Set_Want_Move(false);
    } else if (ev->input_char == "CONTROL_x") {
      cout << "==Turning on want move\n";
      draw->Set_Want_Move(true);
    } else if (ev->input_char == "CONTROL_e") {
      cout << "==Turning off enter leave\n";
      draw->Set_Enter_Leave(false);
    } else if (ev->input_char == "CONTROL_E") {
      cout << "==Turning on enter leave\n";
      draw->Set_Enter_Leave(true);
    } else if (ev->input_char == "CONTROL_w") {
      cout << "==Turning off multiple windows\n";
      draw->Set_Multi_Window(false);
    } else if (ev->input_char == "CONTROL_W") {
      cout << "==Turning on multiple windows\n";
      draw->Set_Multi_Window(true);
    } else if (ev->input_char == "CONTROL_t") {
      cout << "type new input string to test against: ";
      cin >> s;
      test_ic = Am_Input_Char(s);
      test_ic_set = true;
    } else if (ev->input_char == "CONTROL_q") {
      cout << "Quitting\n" << flush;
      exit(0);
    }
  }